

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O1

void __thiscall
mjs::error_object::error_object
          (error_object *this,native_error_type type,string *class_name,object_ptr *prototype,
          string *stack_trace)

{
  undefined1 local_50 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_48;
  
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_001f1968;
  *(native_error_type *)&(this->super_native_object).field_0x24 = type;
  local_50._0_4_ = string;
  local_48.n_ = (double)(class_name->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.
                        heap_;
  local_48.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
       (class_name->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  if (local_48.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    gc_heap::attach(local_48.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
                    (gc_heap_ptr_untyped *)(local_50 + 8));
  }
  value_representation::value_representation(&this->name_,(value *)local_50);
  value::destroy((value *)local_50);
  (this->stack_trace_).pos_ =
       (stack_trace->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  native_object::do_add_native_property
            (&this->super_native_object,"name",dont_delete|dont_enum,
             native_object::
             add_native_property<mjs::error_object,_&mjs::error_object::get_name,_&mjs::error_object::put_name>
             ::anon_class_1_0_00000001::__invoke,
             native_object::
             add_native_property<mjs::error_object,_&mjs::error_object::get_name,_&mjs::error_object::put_name>
             ::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

explicit error_object(native_error_type type, const string& class_name, const object_ptr& prototype, const string& stack_trace)
        : native_object{class_name, prototype}
        , type_(type)
        , name_(value_representation{value{class_name}})
        , stack_trace_(stack_trace.unsafe_raw_get()) {
        DEFINE_NATIVE_PROPERTY(error_object, name);
    }